

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct::forward_int8(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  int *piVar5;
  void *pvVar6;
  int iVar7;
  void *pvVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int i;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float *outptr;
  Mat bottom_blob_tm;
  Option opt_g;
  Mat local_c8;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  long local_60;
  Option local_58;
  
  iVar1 = bottom_blob->w;
  iVar2 = bottom_blob->h;
  uVar3 = bottom_blob->c;
  local_c8.h = bottom_blob->h;
  local_c8.c = bottom_blob->c;
  sVar4 = bottom_blob->elemsize;
  local_c8.data = bottom_blob->data;
  piVar5 = bottom_blob->refcount;
  local_c8.refcount._0_4_ = SUB84(piVar5,0);
  local_c8.refcount._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
  local_c8.elemsize._0_4_ = (undefined4)sVar4;
  local_c8.elemsize._4_4_ = (undefined4)(sVar4 >> 0x20);
  local_c8.elempack = bottom_blob->elempack;
  local_c8.allocator = bottom_blob->allocator;
  local_c8.dims = bottom_blob->dims;
  local_c8.w = bottom_blob->w;
  local_c8.cstep = bottom_blob->cstep;
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + 1;
    UNLOCK();
  }
  if (sVar4 != 1) {
    local_58.use_int8_arithmetic = opt->use_int8_arithmetic;
    local_58.use_packing_layout = opt->use_packing_layout;
    local_58.use_shader_pack8 = opt->use_shader_pack8;
    local_58.use_bf16_storage = opt->use_bf16_storage;
    local_58._36_4_ = *(undefined4 *)&opt->field_0x24;
    local_58.lightmode = opt->lightmode;
    local_58._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_58.num_threads = opt->num_threads;
    local_58.workspace_allocator = opt->workspace_allocator;
    local_58.use_winograd_convolution = opt->use_winograd_convolution;
    local_58.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_58.use_int8_inference = opt->use_int8_inference;
    local_58.use_vulkan_compute = opt->use_vulkan_compute;
    local_58.use_fp16_packed = opt->use_fp16_packed;
    local_58.use_fp16_storage = opt->use_fp16_storage;
    local_58.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    local_58.use_int8_storage = opt->use_int8_storage;
    local_58.blob_allocator = opt->workspace_allocator;
    quantize_float32_to_int8(bottom_blob,&local_c8,this->bottom_blob_int8_scale,&local_58);
  }
  Mat::create(top_blob,this->num_output,4,opt->blob_allocator);
  iVar9 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    local_60 = (long)this->num_output;
    if (0 < local_60) {
      uVar14 = iVar2 * iVar1;
      pvVar6 = top_blob->data;
      local_70 = (this->weight_data).data;
      local_78 = local_c8.data;
      local_68 = (this->weight_data_int8_scales).data;
      iVar1 = this->bias_term;
      iVar2 = this->activation_type;
      local_80 = (this->bias_data).data;
      iVar9 = 0;
      lVar11 = 0;
      do {
        fVar15 = 0.0;
        if (0 < (int)uVar3) {
          lVar13 = (long)iVar9 + (long)local_70;
          uVar10 = 0;
          iVar7 = 0;
          pvVar8 = local_c8.data;
          do {
            if (0 < (int)uVar14) {
              uVar12 = 0;
              do {
                iVar7 = iVar7 + (int)*(char *)(lVar13 + uVar12) *
                                (int)*(char *)((long)pvVar8 + uVar12);
                uVar12 = uVar12 + 1;
              } while (uVar14 != uVar12);
            }
            uVar10 = uVar10 + 1;
            lVar13 = lVar13 + (int)uVar14;
            pvVar8 = (void *)((long)pvVar8 +
                             local_c8.cstep *
                             CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize));
          } while (uVar10 != uVar3);
          fVar15 = (float)iVar7;
        }
        fVar16 = *(float *)((long)local_68 + lVar11 * 4);
        fVar15 = (float)(~-(uint)(fVar16 == 0.0) &
                        (uint)(1.0 / (this->bottom_blob_int8_scale * fVar16))) * fVar15;
        if (iVar1 != 0) {
          fVar15 = fVar15 + *(float *)((long)local_80 + lVar11 * 4);
        }
        fVar16 = 0.0;
        if (0.0 <= fVar15) {
          fVar16 = fVar15;
        }
        if (iVar2 != 1) {
          fVar16 = fVar15;
        }
        *(float *)((long)pvVar6 + lVar11 * 4) = fVar16;
        lVar11 = lVar11 + 1;
        iVar9 = iVar9 + uVar14 * uVar3;
      } while (lVar11 != local_60);
    }
    iVar9 = 0;
  }
  piVar5 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_c8.allocator + 0x18))();
      }
    }
  }
  return iVar9;
}

Assistant:

int InnerProduct::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    Mat bottom_blob_tm = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_float32_to_int8(bottom_blob, bottom_blob_tm, bottom_blob_int8_scale, opt_g);
    }

    top_blob.create(num_output, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob;

        int sum = 0;

        // channels
        for (int q=0; q<channels; q++)
        {
            const signed char* w = (const signed char*)weight_data + size * channels * p + size * q;
            const signed char* m = bottom_blob_tm.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        // dequantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

        float sumfp32 = sum * scale_in;

        if (bias_term)
            sumfp32 += bias_data[p];

        if (activation_type == 1)
        {
            sumfp32 = std::max(sumfp32, 0.f);
        }

        outptr[p] = sumfp32;
    }

    return 0;
}